

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

void VP8LoadFinalBytes(VP8BitReader *br)

{
  byte *pbVar1;
  
  pbVar1 = br->buf_;
  if (pbVar1 < br->buf_end_) {
    br->bits_ = br->bits_ + 8;
    br->buf_ = pbVar1 + 1;
    br->value_ = br->value_ << 8 | (ulong)*pbVar1;
    return;
  }
  if (br->eof_ != 0) {
    br->bits_ = 0;
    return;
  }
  br->value_ = br->value_ << 8;
  br->bits_ = br->bits_ + 8;
  br->eof_ = 1;
  return;
}

Assistant:

void VP8LoadFinalBytes(VP8BitReader* const br) {
  assert(br != NULL && br->buf_ != NULL);
  // Only read 8bits at a time
  if (br->buf_ < br->buf_end_) {
    br->bits_ += 8;
    br->value_ = (bit_t)(*br->buf_++) | (br->value_ << 8);
  } else if (!br->eof_) {
    br->value_ <<= 8;
    br->bits_ += 8;
    br->eof_ = 1;
  } else {
    br->bits_ = 0;  // This is to avoid undefined behaviour with shifts.
  }
}